

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::cycle_edit_action(Application *this)

{
  Application *in_RDI;
  
  if (in_RDI->action == Edit) {
    DynamicScene::XFormWidget::cycleMode(in_RDI->scene->elementTransform);
  }
  else {
    in_RDI->action = Edit;
    setupElementTransformWidget(this);
  }
  updateWidgets(in_RDI);
  return;
}

Assistant:

void Application::cycle_edit_action() {
  if (action != Action::Edit) {
    action = Action::Edit;
    setupElementTransformWidget();
  } else {
    scene->elementTransform->cycleMode();
  }
  updateWidgets();
}